

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doctest.h
# Opt level: O2

void __thiscall doctest::Context::setOption(Context *this,char *option,char *value)

{
  char *lvalue;
  String argv;
  String local_90;
  String local_78;
  String local_60;
  String local_48;
  String local_30;
  
  String::String(&local_48,"-");
  String::String(&local_60,option);
  String::operator+(&local_30,&local_48,&local_60);
  String::String(&local_78,"=");
  String::operator+((String *)&lvalue,&local_30,&local_78);
  String::String(&local_90,value);
  String::operator+(&argv,(String *)&lvalue,&local_90);
  String::~String(&local_90);
  String::~String((String *)&lvalue);
  String::~String(&local_78);
  String::~String(&local_30);
  String::~String(&local_60);
  String::~String(&local_48);
  lvalue = (char *)&argv;
  if (argv.field_0.buf[0x17] < '\0') {
    lvalue = argv.field_0.data.ptr;
  }
  parseArgs(this,1,&lvalue,false);
  String::~String(&argv);
  return;
}

Assistant:

void Context::setOption(const char* option, const char* value) {
    auto argv   = String("-") + option + "=" + value;
    auto lvalue = argv.c_str();
    parseArgs(1, &lvalue);
}